

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

problem * baryonyx::affect(problem *__return_storage_ptr__,context *ctx,problem *pb,
                          int variable_index,bool variable_value)

{
  pointer pbVar1;
  problem *ppVar2;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  bool variable_value_local;
  problem *local_128;
  baryonyx local_120 [16];
  preprocessor<baryonyx::problem> pp;
  
  variable_value_local = variable_value;
  if ((-1 < variable_index) &&
     (variable_index <
      (int)(((long)(pb->vars).values.
                   super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pb->vars).values.
                  super__Vector_base<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0xc))) {
    pbVar1 = (pb->vars).names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_128 = __return_storage_ptr__;
    size = memory_consumed(pb);
    memory_consumed_size<unsigned_long>(size);
    to_string_abi_cxx11_((string *)&pp,local_120,mem);
    info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
              (ctx,"  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
               pbVar1 + (uint)variable_index,&variable_value_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pp);
    std::__cxx11::string::~string((string *)&pp);
    anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::problem>::preprocessor(&pp,ctx,pb);
    ppVar2 = local_128;
    anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::problem>::operator()
              (local_128,&pp,variable_index,variable_value_local);
    anon_unknown.dwarf_eb8f1::preprocessor<baryonyx::problem>::~preprocessor(&pp);
    return ppVar2;
  }
  details::fail_fast("Precondition","variable_index >= 0 && variable_index < length(pb.vars.values)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                     ,"889");
}

Assistant:

problem
affect(const context& ctx,
       const problem& pb,
       int variable_index,
       bool variable_value)
{
    bx_expects(variable_index >= 0 && variable_index < length(pb.vars.values));

    info(
      ctx,
      "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
      pb.vars.names[variable_index],
      variable_value,
      to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return pp(variable_index, variable_value);
}